

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

void __thiscall VRle::Data::opIntersect(Data *this,View a,View b)

{
  Span *pSVar1;
  Span *pSVar2;
  EVP_PKEY_CTX *src;
  Span *pSVar3;
  long lVar4;
  Span *pSVar5;
  size_t sVar6;
  Result result;
  rle_view local_840;
  rle_view local_830;
  EVP_PKEY_CTX local_820 [2040];
  
  pSVar3 = b._data;
  pSVar5 = a._data;
  pSVar1 = pSVar5 + a._size;
  pSVar2 = pSVar3 + b._size;
  lVar4 = a._size << 3;
  while( true ) {
    local_830._data = pSVar3;
    local_840._data = pSVar1;
    if (lVar4 == 0) goto LAB_0010fbb7;
    if (pSVar3->y <= pSVar5->y) break;
    pSVar5 = pSVar5 + 1;
    lVar4 = lVar4 + -8;
  }
  lVar4 = b._size << 3;
  for (; (local_830._data = pSVar2, local_840._data = pSVar5, lVar4 != 0 &&
         (local_830._data = pSVar3, pSVar3->y < pSVar5->y)); pSVar3 = pSVar3 + 1) {
    lVar4 = lVar4 + -8;
  }
LAB_0010fbb7:
  sVar6 = (long)pSVar1 - (long)local_840._data >> 3;
  local_830._size = (long)pSVar2 - (long)local_830._data >> 3;
  local_840._size = sVar6;
  std::array<VRle::Span,_255UL>::array((array<VRle::Span,_255UL> *)local_820);
  while (sVar6 != 0) {
    src = (EVP_PKEY_CTX *)_opIntersect(&local_840,&local_830,(Result *)local_820);
    sVar6 = local_840._size;
    if (src != (EVP_PKEY_CTX *)0x0) {
      copy(local_820,src);
      sVar6 = local_840._size;
    }
  }
  updateBbox(this);
  return;
}

Assistant:

void VRle::Data::opIntersect(VRle::View a, VRle::View b)
{
    _opIntersectPrepare(a, b);
    Result result;
    while (a.size()) {
        auto count = _opIntersect(a, b, result);
        if (count) copy(result.data(), count, mSpans);
    }

    updateBbox();
}